

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall S2Builder::CopyInputEdges(S2Builder *this)

{
  pointer *ppVVar1;
  Vector3<double> *__args;
  double *pdVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  pointer pVVar6;
  iterator __position;
  pointer ppVar7;
  VType VVar8;
  InputEdge *e;
  pointer ppVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> sorted;
  vector<int,_std::allocator<int>_> vmap;
  allocator_type local_69;
  vector<Vector3<double>,std::allocator<Vector3<double>>> *local_68;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  SortInputVertices(&local_60,this);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,
             ((long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_69);
  local_68 = (vector<Vector3<double>,std::allocator<Vector3<double>>> *)&this->sites_;
  pVVar6 = (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar6) {
    (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar6;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_68,
             ((long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->input_vertices_).
                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if ((long)local_60.
            super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_60.
            super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar10 = ((long)local_60.
                    super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_60.
                    super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    uVar12 = 0;
    iVar11 = 0;
    do {
      iVar5 = local_60.
              super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar12].second;
      pVVar6 = (this->input_vertices_).
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      __position._M_current =
           (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      __args = pVVar6 + iVar5;
      iVar13 = (int)((ulong)((long)__position._M_current -
                            (long)(this->sites_).
                                  super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar5] = iVar13;
      iVar11 = iVar11 + 1;
      uVar12 = (ulong)iVar11;
      if (uVar12 < uVar10) {
        dVar3 = __args->c_[0];
        while( true ) {
          iVar11 = local_60.
                   super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].second;
          if ((pVVar6[iVar11].c_[0] != dVar3) || (NAN(pVVar6[iVar11].c_[0]) || NAN(dVar3))) break;
          lVar14 = 0;
          while (lVar14 != 0x10) {
            dVar4 = *(double *)((long)pVVar6[iVar11].c_ + lVar14 + 8);
            pdVar2 = (double *)((long)pVVar6[iVar5].c_ + lVar14 + 8);
            lVar14 = lVar14 + 8;
            if ((dVar4 != *pdVar2) || (NAN(dVar4) || NAN(*pdVar2))) goto LAB_001acfeb;
          }
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar11] = iVar13;
          uVar12 = uVar12 + 1;
          if (uVar10 <= uVar12) break;
        }
LAB_001acfeb:
        iVar11 = (int)uVar12;
      }
      if (__position._M_current ==
          (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>(local_68,__position,__args);
      }
      else {
        (__position._M_current)->c_[2] = __args->c_[2];
        VVar8 = __args->c_[1];
        (__position._M_current)->c_[0] = __args->c_[0];
        (__position._M_current)->c_[1] = VVar8;
        ppVVar1 = &(this->sites_).
                   super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      uVar12 = (ulong)iVar11;
      uVar10 = ((long)local_60.
                      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_60.
                      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator=
            (&this->input_vertices_,
             (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_68);
  ppVar7 = (this->input_edges_).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ppVar9 = (this->input_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar7; ppVar9 = ppVar9 + 1) {
    ppVar9->first =
         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[ppVar9->first];
    ppVar9->second =
         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[ppVar9->second];
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2Builder::CopyInputEdges() {
  // Sort the input vertices, discard duplicates, and update the input edges
  // to refer to the pruned vertex list.  (We sort in the same order used by
  // ChooseInitialSites() to avoid inconsistencies in tests.)
  vector<InputVertexKey> sorted = SortInputVertices();
  vector<InputVertexId> vmap(input_vertices_.size());
  sites_.clear();
  sites_.reserve(input_vertices_.size());
  for (int in = 0; in < sorted.size(); ) {
    const S2Point& site = input_vertices_[sorted[in].second];
    vmap[sorted[in].second] = sites_.size();
    while (++in < sorted.size() && input_vertices_[sorted[in].second] == site) {
      vmap[sorted[in].second] = sites_.size();
    }
    sites_.push_back(site);
  }
  input_vertices_ = sites_;
  for (InputEdge& e : input_edges_) {
    e.first = vmap[e.first];
    e.second = vmap[e.second];
  }
}